

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

void printcmd(uint32_t off,uint32_t length)

{
  uint local_14;
  int i;
  uint32_t length_local;
  uint32_t off_local;
  
  printf("0x%08x:",(ulong)off);
  for (local_14 = 0; local_14 < length; local_14 = local_14 + 1) {
    printf(" %02x",(ulong)bios->data[off + local_14]);
  }
  for (; (int)local_14 < 0x10; local_14 = local_14 + 1) {
    printf("   ");
  }
  return;
}

Assistant:

void printcmd (uint32_t off, uint32_t length) {
	printf ("0x%08x:", off);
	int i;
	for (i = 0; i < length; i++)
		printf(" %02x", bios->data[off+i]);
	for (; i < 16; i++)
		printf ("   ");
}